

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O3

QString * __thiscall
QSslCertificate::issuerDisplayName(QString *__return_storage_ptr__,QSslCertificate *this)

{
  _Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
  _Var1;
  Data *pDVar2;
  QString *pQVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QTypedArrayData<QString> *tmp;
  Data *pDVar6;
  QString *tmp_1;
  QString *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_88;
  QArrayDataPointer<QString> local_68;
  QArrayDataPointer<QString> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl =
       (((this->d).d.ptr)->backend)._M_t.
       super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
       .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>;
  if (_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl ==
      (X509Certificate *)0x0) {
    qVar4 = 0;
    pQVar7 = (QString *)0x0;
    pDVar6 = (Data *)0x0;
  }
  else {
    (**(code **)(*(long *)_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>.
                          _M_head_impl + 0x38))
              (&local_88,
               _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl,1);
    pDVar6 = local_88.d;
    qVar4 = local_88.size;
    pQVar7 = local_88.ptr;
  }
  local_88.d = (Data *)0x0;
  local_88.ptr = (QString *)0x0;
  local_88.size = 0;
  local_50.d = (Data *)0x0;
  local_50.ptr = (QString *)0x0;
  local_50.size = 0;
  local_68.d = pDVar6;
  local_68.ptr = pQVar7;
  local_68.size = qVar4;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  pQVar3 = pQVar7;
  if (qVar4 == 0) {
    _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl =
         (((this->d).d.ptr)->backend)._M_t.
         super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
         .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>;
    if (_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl ==
        (X509Certificate *)0x0) {
      qVar4 = 0;
      pQVar3 = (QString *)0x0;
      pDVar5 = (Data *)0x0;
    }
    else {
      (**(code **)(*(long *)_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>.
                            _M_head_impl + 0x38))
                (&local_88,
                 _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl,0);
      pQVar3 = local_88.ptr;
      pDVar5 = local_88.d;
      qVar4 = local_88.size;
    }
    local_88.d = (Data *)0x0;
    local_88.ptr = (QString *)0x0;
    local_88.size = 0;
    local_50.size = 0;
    local_68.d = pDVar5;
    local_68.ptr = pQVar3;
    local_68.size = qVar4;
    local_50.d = pDVar6;
    local_50.ptr = pQVar7;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    if (qVar4 != 0) goto LAB_001cc860;
    _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl =
         (((this->d).d.ptr)->backend)._M_t.
         super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
         .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>;
    if (_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl ==
        (X509Certificate *)0x0) {
      qVar4 = 0;
      pQVar7 = (QString *)0x0;
      local_68.d = (Data *)0x0;
    }
    else {
      (**(code **)(*(long *)_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>.
                            _M_head_impl + 0x38))
                (&local_88,
                 _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl,3);
      local_68.d = local_88.d;
      qVar4 = local_88.size;
      pQVar7 = local_88.ptr;
    }
    local_88.d = (Data *)0x0;
    local_88.ptr = (QString *)0x0;
    local_88.size = 0;
    local_50.size = 0;
    local_68.ptr = pQVar7;
    local_68.size = qVar4;
    local_50.d = pDVar5;
    local_50.ptr = pQVar3;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    if (qVar4 == 0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      goto LAB_001cc87f;
    }
    pDVar2 = (pQVar7->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (pQVar7->d).ptr;
    qVar4 = (pQVar7->d).size;
  }
  else {
LAB_001cc860:
    pDVar2 = (pQVar3->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (pQVar3->d).ptr;
    qVar4 = (pQVar3->d).size;
  }
  (__return_storage_ptr__->d).size = qVar4;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_001cc87f:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSslCertificate::issuerDisplayName() const
{
    QStringList names;
    names = issuerInfo(QSslCertificate::CommonName);
    if (!names.isEmpty())
        return names.constFirst();
    names = issuerInfo(QSslCertificate::Organization);
    if (!names.isEmpty())
        return names.constFirst();
    names = issuerInfo(QSslCertificate::OrganizationalUnitName);
    if (!names.isEmpty())
        return names.constFirst();

    return QString();
}